

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

int sparse_list_add(pax *pax,int64_t offset,int64_t length)

{
  long lStack_30;
  int r;
  int64_t last_offset;
  int64_t length_local;
  int64_t offset_local;
  pax *pax_local;
  
  if (pax->sparse_tail == (sparse_block_conflict *)0x0) {
    lStack_30 = 0;
  }
  else {
    lStack_30 = pax->sparse_tail->offset + pax->sparse_tail->remaining;
  }
  if ((offset <= lStack_30) ||
     (pax_local._4_4_ = _sparse_list_add_block(pax,lStack_30,offset - lStack_30,1),
     pax_local._4_4_ == 0)) {
    pax_local._4_4_ = _sparse_list_add_block(pax,offset,length,0);
  }
  return pax_local._4_4_;
}

Assistant:

static int
sparse_list_add(struct pax *pax, int64_t offset, int64_t length)
{
	int64_t last_offset;
	int r;

	if (pax->sparse_tail == NULL)
		last_offset = 0;
	else {
		last_offset = pax->sparse_tail->offset +
		    pax->sparse_tail->remaining;
	}
	if (last_offset < offset) {
		/* Add a hole block. */
		r = _sparse_list_add_block(pax, last_offset,
		    offset - last_offset, 1);
		if (r != ARCHIVE_OK)
			return (r);
	}
	/* Add data block. */
	return (_sparse_list_add_block(pax, offset, length, 0));
}